

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::NotImplementedException::NotImplementedException
          (NotImplementedException *this,SourceLineInfo *lineInfo)

{
  ostream *poVar1;
  exception *in_RDI;
  SourceLineInfo *this_00;
  ostringstream oss;
  SourceLineInfo *in_stack_fffffffffffffe28;
  string local_1b8 [32];
  ostringstream local_198 [408];
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__NotImplementedException_002c1da0;
  this_00 = (SourceLineInfo *)(in_RDI + 8);
  std::__cxx11::string::string((string *)this_00);
  SourceLineInfo::SourceLineInfo(this_00,in_stack_fffffffffffffe28);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = Catch::operator<<((ostream *)this_00,in_stack_fffffffffffffe28);
  std::operator<<(poVar1,": function ");
  std::operator<<((ostream *)local_198,"not implemented");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

NotImplementedException::NotImplementedException( SourceLineInfo const& lineInfo )
    :   m_lineInfo( lineInfo ) {
        std::ostringstream oss;
        oss << lineInfo << ": function ";
        oss << "not implemented";
        m_what = oss.str();
    }